

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::SwapColumns(Matrix *this,int first_column,int second_column)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  int row;
  long lVar6;
  long lVar7;
  long lVar8;
  
  bVar4 = false;
  if ((first_column != second_column) && (bVar4 = false, 0 < this->n_)) {
    lVar7 = (long)first_column;
    lVar8 = (long)second_column;
    lVar5 = 0;
    lVar6 = 0;
    bVar4 = false;
    do {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar5);
      bVar3 = operator!=((Fraction *)(lVar1 + lVar7 * 8),(Fraction *)(lVar1 + lVar8 * 8));
      if (bVar3) {
        lVar1 = *(long *)((long)&(((this->elements_).
                                   super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                                 super__Vector_impl_data + lVar5);
        uVar2 = *(undefined8 *)(lVar1 + lVar7 * 8);
        *(undefined8 *)(lVar1 + lVar7 * 8) = *(undefined8 *)(lVar1 + lVar8 * 8);
        *(undefined8 *)(lVar1 + lVar8 * 8) = uVar2;
        bVar4 = true;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x18;
    } while (lVar6 < this->n_);
  }
  return bVar4;
}

Assistant:

bool Matrix::SwapColumns(int first_column, int second_column) {
  if (first_column == second_column) {
    return false;
  }

  int result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][first_column] != elements_[row][second_column]) {
      result = true;
      std::swap(elements_[row][first_column], elements_[row][second_column]);
    }
  }

  return result;
}